

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

ArenaData ** __thiscall
DListBase<Memory::ArenaData*,RealCount>::
PrependNode<Memory::NoThrowHeapAllocator,Memory::ArenaData*>
          (DListBase<Memory::ArenaData*,RealCount> *this,NoThrowHeapAllocator *allocator,
          ArenaData *param1)

{
  NoThrowHeapAllocator *alloc;
  DListNode<Memory::ArenaData_*> *this_00;
  DListNodeBase<Memory::ArenaData_*> **ppDVar1;
  TrackAllocData local_58;
  DListNode<Memory::ArenaData_*> *local_30;
  Node *newNode;
  ArenaData *param1_local;
  NoThrowHeapAllocator *allocator_local;
  DListBase<Memory::ArenaData_*,_RealCount> *this_local;
  
  newNode = (Node *)param1;
  param1_local = (ArenaData *)allocator;
  allocator_local = (NoThrowHeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&DListNode<Memory::ArenaData*>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x117);
  alloc = Memory::NoThrowHeapAllocator::TrackAllocInfo(allocator,&local_58);
  this_00 = (DListNode<Memory::ArenaData_*> *)new<Memory::NoThrowHeapAllocator>(0x18,alloc,0x8f5de0)
  ;
  DListNode<Memory::ArenaData_*>::DListNode(this_00,(ArenaData **)&newNode);
  if (this_00 == (DListNode<Memory::ArenaData_*> *)0x0) {
    this_local = (DListBase<Memory::ArenaData_*,_RealCount> *)0x0;
  }
  else {
    local_30 = this_00;
    ppDVar1 = DListNodeBase<Memory::ArenaData_*>::Next((DListNodeBase<Memory::ArenaData_*> *)this);
    DListBase<Memory::ArenaData_*,_RealCount>::InsertNodeBefore
              (*ppDVar1,&local_30->super_DListNodeBase<Memory::ArenaData_*>);
    RealCount::IncrementCount((RealCount *)(this + 0x10));
    this_local = (DListBase<Memory::ArenaData_*,_RealCount> *)&local_30->data;
  }
  return (ArenaData **)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }